

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O2

void __thiscall slang::ast::ScriptSession::ScriptSession(ScriptSession *this,Bag *options)

{
  CompilationOptions *pCVar1;
  CompilationUnitSymbol *pCVar2;
  
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                *)this,(table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                        *)options);
  pCVar1 = Bag::insertOrGet<slang::ast::CompilationOptions>(&this->options);
  *(byte *)&(pCVar1->flags).m_bits = (byte)(pCVar1->flags).m_bits | 1;
  Compilation::Compilation(&this->compilation,&this->options,(SourceLibrary *)0x0);
  pCVar2 = Compilation::createScriptScope(&this->compilation);
  this->scope = pCVar2;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->astCtx).scope.ptr = &pCVar2->super_Scope;
  (this->astCtx).lookupIndex = 0xffffffff;
  (this->astCtx).flags.m_bits = 0;
  (this->astCtx).instanceOrProc = (Symbol *)0x0;
  (this->astCtx).firstTempVar = (TempVarSymbol *)0x0;
  (this->astCtx).randomizeDetails = (RandomizeDetails *)0x0;
  (this->astCtx).assertionInstance = (AssertionInstanceDetails *)0x0;
  EvalContext::EvalContext(&this->evalContext,&this->astCtx,(bitmask<slang::ast::EvalFlags>)0x1);
  EvalContext::pushEmptyFrame(&this->evalContext);
  return;
}

Assistant:

ScriptSession::ScriptSession(Bag options) :
    options(std::move(options)), compilation(createOptions(this->options)),
    scope(compilation.createScriptScope()), astCtx(scope, LookupLocation::max),
    evalContext(astCtx, EvalFlags::IsScript) {
    evalContext.pushEmptyFrame();
}